

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibtexreader.hpp
# Opt level: O2

bool bibtex::
     read<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
               (basic_istream_iterator<char,_std::char_traits<char>_> *first,
               basic_istream_iterator<char,_std::char_traits<char>_> *last,
               expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>
               *skipper,vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_> *entries,
               enable_if<boost::is_same<bibtex::BibTeXEntry,_bibtex::BibTeXEntry>,_void> *param_5)

{
  bool bVar1;
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  parser;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_698;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<bibtex::BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>_&>,_1L>
  local_688;
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  local_680;
  
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  ::BibTeXReader(&local_680);
  local_698.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = (last->
            super_multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
            ).
            super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
            .member;
  local_698.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       (multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
        )(last->
         super_multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
         ).super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
         super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
         .super_unique<char>.queued_position;
  if (local_698.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
      .member != (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0) {
    LOCK();
    ((local_698.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
     .member)->
    super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
    ).super_shared.count.value_ =
         ((local_698.
           super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
          .member)->
         super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
         ).super_shared.count.value_ + 1;
    UNLOCK();
  }
  local_688.child0 = &local_680;
  bVar1 = boost::spirit::qi::
          phrase_parse<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<bibtex::BibTeXReader<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag___pirit::tag::eol>,0l>>,2l>>,2l>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                    (first,(basic_istream_iterator<char,_std::char_traits<char>_> *)&local_698,
                     &local_688,skipper,entries);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_698);
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  ::~BibTeXReader(&local_680);
  return bVar1;
}

Assistant:

inline bool read(ForwardIterator first, ForwardIterator last, Skipper& skipper,
    Container& entries, boost::enable_if<boost::is_same<
        typename Container::value_type, BibTeXEntry> >* /*dummy*/ = NULL)
{
    BibTeXReader<ForwardIterator, Skipper> parser;
    return boost::spirit::qi::phrase_parse(first, last, *parser, skipper,
        entries);
}